

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdCelsiusPolygonMode::emulate_mthd(MthdCelsiusPolygonMode *this)

{
  pgraph_state *state;
  byte bVar1;
  uint uVar2;
  uint32_t err;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  err = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4;
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val - 0x1b00;
  if (uVar2 < 3) {
    if (err == 0) {
      if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
        bVar1 = (char)this->which * '\x02';
        uVar2 = (uint)(*(long *)(&DAT_00290e58 + (ulong)uVar2 * 8) << (bVar1 & 0x3f)) |
                ~(uint)(3L << (bVar1 & 0x3f)) &
                (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster;
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster = uVar2;
        pgraph_celsius_icmd(state,0x22,uVar2,true);
        return;
      }
      return;
    }
  }
  else {
    err = err | 1;
  }
  MthdTest::warn((MthdTest *)this,err);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		uint32_t rv = 0;
		switch (val) {
			case 0x1b00:
				rv = 1;
				break;
			case 0x1b01:
				rv = 2;
				break;
			case 0x1b02:
				rv = 0;
				break;
			default:
				err |= 1;
		}
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_raster, which * 2, 2, rv);
				pgraph_celsius_icmd(&exp, 0x22, exp.bundle_raster, true);
			}
		}
	}